

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_impl.cpp
# Opt level: O1

MPP_RET mpp_ops_reset(MppDump info)

{
  pthread_mutex_t *__mutex;
  MppDumpImpl *p;
  
  if (info != (MppDump)0x0) {
    __mutex = *info;
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock(__mutex);
    }
    if (*(FILE **)((long)info + 0x38) != (FILE *)0x0) {
      _ops_log(*(FILE **)((long)info + 0x38),"%d,%s\n",(ulong)*(uint *)((long)info + 0x58),"rst");
    }
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_unlock(__mutex);
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_ops_reset(MppDump info)
{
    MppDumpImpl *p = (MppDumpImpl *)info;
    if (NULL == p)
        return MPP_OK;

    AutoMutex auto_lock(p->lock);

    if (p->fp_ops)
        ops_log(p->fp_ops, "%d,%s\n", p->idx, "rst");

    return MPP_OK;
}